

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpSocket.cpp
# Opt level: O2

void __thiscall Liby::UdpSocket::handleReadEvent(UdpSocket *this)

{
  UdpConnection *__args;
  ulong uVar1;
  iterator iVar2;
  int *piVar3;
  shared_ptr<Liby::UdpConnection> uconn;
  Endpoint peer;
  shared_ptr<Liby::UdpSocket> self;
  char buffer [4096];
  UdpSocket *in_stack_ffffffffffffef68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1090;
  function<void_(Liby::UdpConnection_&)> *local_1088;
  _Rb_tree<Liby::Endpoint,std::pair<Liby::Endpoint_const,std::shared_ptr<Liby::UdpConnection>>,std::_Select1st<std::pair<Liby::Endpoint_const,std::shared_ptr<Liby::UdpConnection>>>,std::less<Liby::Endpoint>,std::allocator<std::pair<Liby::Endpoint_const,std::shared_ptr<Liby::UdpConnection>>>>
  *local_1080;
  function<void_(Liby::UdpConnection_&)> *local_1078;
  _Base_ptr local_1070;
  pair<Liby::Endpoint,_std::shared_ptr<Liby::UdpConnection>_> local_1068;
  Endpoint local_1050;
  __shared_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2> local_1048;
  char local_1038 [4104];
  
  std::__shared_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1048,
             &(this->self_).super___shared_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>);
  local_1080 = (_Rb_tree<Liby::Endpoint,std::pair<Liby::Endpoint_const,std::shared_ptr<Liby::UdpConnection>>,std::_Select1st<std::pair<Liby::Endpoint_const,std::shared_ptr<Liby::UdpConnection>>>,std::less<Liby::Endpoint>,std::allocator<std::pair<Liby::Endpoint_const,std::shared_ptr<Liby::UdpConnection>>>>
                *)&this->conns_;
  local_1070 = &(this->conns_)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_1088 = &this->readEventCallback_;
  local_1078 = &this->acceptorCallback_;
  while( true ) {
    uVar1 = Socket::recvfrom((this->socket_).
                             super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                             (int)local_1038,(void *)0x1000,0,0x12f628,
                             (sockaddr *)&handleReadEvent::addr_len,
                             (socklen_t *)in_stack_ffffffffffffef68);
    if ((int)uVar1 < 0) break;
    Endpoint::Endpoint(&local_1050,&handleReadEvent::address);
    iVar2 = std::
            _Rb_tree<Liby::Endpoint,_std::pair<const_Liby::Endpoint,_std::shared_ptr<Liby::UdpConnection>_>,_std::_Select1st<std::pair<const_Liby::Endpoint,_std::shared_ptr<Liby::UdpConnection>_>_>,_std::less<Liby::Endpoint>,_std::allocator<std::pair<const_Liby::Endpoint,_std::shared_ptr<Liby::UdpConnection>_>_>_>
            ::find((_Rb_tree<Liby::Endpoint,_std::pair<const_Liby::Endpoint,_std::shared_ptr<Liby::UdpConnection>_>,_std::_Select1st<std::pair<const_Liby::Endpoint,_std::shared_ptr<Liby::UdpConnection>_>_>,_std::less<Liby::Endpoint>,_std::allocator<std::pair<const_Liby::Endpoint,_std::shared_ptr<Liby::UdpConnection>_>_>_>
                    *)local_1080,&local_1050);
    if (iVar2._M_node == local_1070) {
      local_1068.first = (Endpoint)this;
      std::make_shared<Liby::UdpConnection,Liby::UdpSocket*,Liby::Endpoint&>
                ((UdpSocket **)&stack0xffffffffffffef68,&local_1068.first);
      local_1068.first = local_1050;
      std::__shared_ptr<Liby::UdpConnection,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_1068.second.
                  super___shared_ptr<Liby::UdpConnection,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<Liby::UdpConnection,_(__gnu_cxx::_Lock_policy)2> *)
                 &stack0xffffffffffffef68);
      std::
      _Rb_tree<Liby::Endpoint,std::pair<Liby::Endpoint_const,std::shared_ptr<Liby::UdpConnection>>,std::_Select1st<std::pair<Liby::Endpoint_const,std::shared_ptr<Liby::UdpConnection>>>,std::less<Liby::Endpoint>,std::allocator<std::pair<Liby::Endpoint_const,std::shared_ptr<Liby::UdpConnection>>>>
      ::_M_emplace_unique<std::pair<Liby::Endpoint,std::shared_ptr<Liby::UdpConnection>>>
                (local_1080,&local_1068);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_1068.second.
                  super___shared_ptr<Liby::UdpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      if ((this->acceptorCallback_).super__Function_base._M_manager != (_Manager_type)0x0) {
        std::function<void_(Liby::UdpConnection_&)>::operator()
                  (local_1078,(UdpConnection *)in_stack_ffffffffffffef68);
      }
      Buffer::append((Buffer *)&in_stack_ffffffffffffef68->poller_,local_1038,uVar1 & 0xffffffff);
      if ((this->readEventCallback_).super__Function_base._M_manager != (_Manager_type)0x0) {
        std::function<void_(Liby::UdpConnection_&)>::operator()
                  (local_1088,(UdpConnection *)in_stack_ffffffffffffef68);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1090);
    }
    else {
      __args = (UdpConnection *)iVar2._M_node[1]._M_parent;
      Buffer::append(&__args->readBuf_,local_1038,uVar1 & 0xffffffff);
      if ((this->readEventCallback_).super__Function_base._M_manager != (_Manager_type)0x0) {
        std::function<void_(Liby::UdpConnection_&)>::operator()(local_1088,__args);
      }
    }
  }
  piVar3 = __errno_location();
  if (*piVar3 != 0xb) {
    handleErroEvent(this);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1048._M_refcount);
  return;
}

Assistant:

void UdpSocket::handleReadEvent() {
    auto self = self_;

    char buffer[4096];

    for (;;) {
        static struct sockaddr_in address;
        static socklen_t addr_len = sizeof(struct sockaddr_in);

        int n = socket_->recvfrom(buffer, sizeof(buffer), 0,
                                  (struct sockaddr *)&address, &addr_len);

        if (n < 0) {
            if (errno != EAGAIN) {
                handleErroEvent();
            }
            break;
        }

        Endpoint peer(&address);
        auto it = conns_.find(peer);
        if (it == conns_.end()) {
            // a new udp conn
            auto uconn = std::make_shared<UdpConnection>(this, peer);
            conns_.insert(std::make_pair(peer, uconn));
            if (acceptorCallback_) {
                acceptorCallback_(*uconn);
            }
            uconn->getReadBuf().append(buffer, n);
            if (readEventCallback_) {
                readEventCallback_(*uconn);
            }
        } else {
            UdpConnection &uconn = *(it->second);
            uconn.getReadBuf().append(buffer, n);
            if (readEventCallback_) {
                readEventCallback_(uconn);
            }
        }
    }
}